

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

string * __thiscall
libcellml::Printer::PrinterImpl::printVariable
          (string *__return_storage_ptr__,PrinterImpl *this,VariablePtr *variable,IdList *idList,
          bool autoIds)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string interface_type;
  string initial_value;
  string units;
  string id;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  NamedEntity::name_abi_cxx11_
            (&local_60,
             &((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_NamedEntity);
  Entity::id_abi_cxx11_
            (&local_80,
             (Entity *)
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  Variable::units((Variable *)&local_c0);
  if (local_c0._M_dataplus._M_p == (pointer)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"",(allocator<char> *)&local_e0);
  }
  else {
    Variable::units((Variable *)&local_e0);
    NamedEntity::name_abi_cxx11_(&local_a0,(NamedEntity *)local_e0._M_dataplus._M_p);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e0._M_string_length);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0._M_string_length);
  Variable::initialValue_abi_cxx11_
            (&local_c0,
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  Variable::interfaceType_abi_cxx11_
            (&local_e0,
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  if (local_60._M_string_length != 0) {
    std::operator+(&local_120," name=\"",&local_60);
    std::operator+(&local_100,&local_120,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  if (local_a0._M_string_length != 0) {
    std::operator+(&local_120," units=\"",&local_a0);
    std::operator+(&local_100,&local_120,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  if (local_c0._M_string_length != 0) {
    std::operator+(&local_120," initial_value=\"",&local_c0);
    std::operator+(&local_100,&local_120,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  if (local_e0._M_string_length != 0) {
    std::operator+(&local_120," interface=\"",&local_e0);
    std::operator+(&local_100,&local_120,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  if (local_80._M_string_length == 0) {
    if (!autoIds) goto LAB_00208d08;
    makeUniqueId(&local_40,idList);
    std::operator+(&local_120," id=\"",&local_40);
    std::operator+(&local_100,&local_120,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    this_00 = &local_40;
  }
  else {
    std::operator+(&local_120," id=\"",&local_80);
    std::operator+(&local_100,&local_120,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_100);
    this_00 = &local_120;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00208d08:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string Printer::PrinterImpl::printVariable(const VariablePtr &variable, IdList &idList, bool autoIds)
{
    std::string repr;
    repr += "<variable";
    std::string name = variable->name();
    std::string id = variable->id();
    std::string units = variable->units() != nullptr ? variable->units()->name() : "";
    std::string initial_value = variable->initialValue();
    std::string interface_type = variable->interfaceType();
    if (!name.empty()) {
        repr += " name=\"" + name + "\"";
    }
    if (!units.empty()) {
        repr += " units=\"" + units + "\"";
    }
    if (!initial_value.empty()) {
        repr += " initial_value=\"" + initial_value + "\"";
    }
    if (!interface_type.empty()) {
        repr += " interface=\"" + interface_type + "\"";
    }
    if (!id.empty()) {
        repr += " id=\"" + id + "\"";
    } else if (autoIds) {
        repr += " id=\"" + makeUniqueId(idList) + "\"";
    }

    repr += "/>";
    return repr;
}